

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

void __thiscall
rapidxml::xml_document<char>::parse_node_contents<0>
          (xml_document<char> *this,char **text,xml_node<char> *node)

{
  char *contents_start_00;
  parse_error *ppVar1;
  xml_node<char> *child_00;
  xml_node<char> *child;
  char local_29;
  char next_char;
  char *contents_start;
  xml_node<char> *node_local;
  char **text_local;
  xml_document<char> *this_local;
  
  while( true ) {
    contents_start_00 = *text;
    skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
    local_29 = **text;
    while( true ) {
      if (local_29 == '\0') {
        ppVar1 = (parse_error *)__cxa_allocate_exception(0x18);
        parse_error::parse_error(ppVar1,"unexpected end of data",*text);
        __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
      }
      if (local_29 == '<') break;
      local_29 = parse_and_append_data<0>(this,node,text,contents_start_00);
    }
    if ((*text)[1] == '/') break;
    *text = *text + 1;
    child_00 = parse_node<0>(this,text);
    if (child_00 != (xml_node<char> *)0x0) {
      xml_node<char>::append_node(node,child_00);
    }
  }
  *text = *text + 2;
  skip<rapidxml::xml_document<char>::node_name_pred,0>(text);
  skip<rapidxml::xml_document<char>::whitespace_pred,0>(text);
  if (**text == '>') {
    *text = *text + 1;
    return;
  }
  ppVar1 = (parse_error *)__cxa_allocate_exception(0x18);
  parse_error::parse_error(ppVar1,"expected >",*text);
  __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

void parse_node_contents(Ch *&text, xml_node<Ch> *node)
        {
            // For all children and text
            while (1)
            {
                // Skip whitespace between > and node contents
                Ch *contents_start = text;      // Store start of node contents before whitespace is skipped
                skip<whitespace_pred, Flags>(text);
                Ch next_char = *text;

            // After data nodes, instead of continuing the loop, control jumps here.
            // This is because zero termination inside parse_and_append_data() function
            // would wreak havoc with the above code.
            // Also, skipping whitespace after data nodes is unnecessary.
            after_data_node:    
                
                // Determine what comes next: node closing, child node, data node, or 0?
                switch (next_char)
                {
                
                // Node closing or child node
                case Ch('<'):
                    if (text[1] == Ch('/'))
                    {
                        // Node closing
                        text += 2;      // Skip '</'
                        if (Flags & parse_validate_closing_tags)
                        {
                            // Skip and validate closing tag name
                            Ch *closing_name = text;
                            skip<node_name_pred, Flags>(text);
                            if (!internal::compare(node->name(), node->name_size(), closing_name, text - closing_name, true))
                                RAPIDXML_PARSE_ERROR("invalid closing tag name", text);
                        }
                        else
                        {
                            // No validation, just skip name
                            skip<node_name_pred, Flags>(text);
                        }
                        // Skip remaining whitespace after node name
                        skip<whitespace_pred, Flags>(text);
                        if (*text != Ch('>'))
                            RAPIDXML_PARSE_ERROR("expected >", text);
                        ++text;     // Skip '>'
                        return;     // Node closed, finished parsing contents
                    }
                    else
                    {
                        // Child node
                        ++text;     // Skip '<'
                        if (xml_node<Ch> *child = parse_node<Flags>(text))
                            node->append_node(child);
                    }
                    break;

                // End of data - error
                case Ch('\0'):
                    RAPIDXML_PARSE_ERROR("unexpected end of data", text);

                // Data node
                default:
                    next_char = parse_and_append_data<Flags>(node, text, contents_start);
                    goto after_data_node;   // Bypass regular processing after data nodes

                }
            }
        }